

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::_q_handleFieldObjectDestroyed(QWizardPrivate *this,QObject *object)

{
  QList<QWizardField> *this_00;
  int iVar1;
  int iVar2;
  iterator pos;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  QMap<QString,_int> *this_01;
  long in_FS_OFFSET;
  int local_54;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fields;
  pos = QList<QWizardField>::begin(this_00);
  this_01 = &this->fieldIndexMap;
  iVar2 = -1;
  while( true ) {
    iVar3 = QList<QWizardField>::end(this_00);
    if (pos.i == iVar3.i) break;
    if ((pos.i)->object == object) {
      local_50.d = (Data *)CONCAT44(local_50.d._4_4_,0xffffffff);
      iVar2 = QMap<QString,_int>::value(this_01,&(pos.i)->name,(int *)&local_50);
      QMap<QString,_int>::remove(this_01,(char *)&(pos.i)->name);
      pos = QList<QWizardField>::erase(this_00,pos.i);
    }
    else {
      pos.i = pos.i + 1;
    }
  }
  if (iVar2 != -1) {
    iVar4._M_node = (_Base_ptr)QMap<QString,_int>::begin(this_01);
    while( true ) {
      iVar5 = QMap<QString,_int>::end(this_01);
      if ((iterator)iVar4._M_node == iVar5.i._M_node) break;
      iVar1 = *(int *)&iVar4._M_node[1]._M_right;
      if (iVar2 < iVar1) {
        local_50.d = *(Data **)(iVar4._M_node + 1);
        local_50.ptr = (char16_t *)iVar4._M_node[1]._M_parent;
        local_50.size = (qsizetype)iVar4._M_node[1]._M_left;
        if (local_50.d != (Data *)0x0) {
          LOCK();
          ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_54 = iVar1 + -1;
        QMap<QString,_int>::insert(this_01,(QString *)&local_50,&local_54);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      }
      iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::_q_handleFieldObjectDestroyed(QObject *object)
{
    int destroyed_index = -1;
    QList<QWizardField>::iterator it = fields.begin();
    while (it != fields.end()) {
        const QWizardField &field = *it;
        if (field.object == object) {
            destroyed_index = fieldIndexMap.value(field.name, -1);
            fieldIndexMap.remove(field.name);
            it = fields.erase(it);
        } else {
            ++it;
        }
    }
    if (destroyed_index != -1) {
        QMap<QString, int>::iterator it2 = fieldIndexMap.begin();
        while (it2 != fieldIndexMap.end()) {
            int index = it2.value();
            if (index > destroyed_index) {
                QString field_name = it2.key();
                fieldIndexMap.insert(field_name, index-1);
            }
            ++it2;
        }
    }
}